

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O3

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  uint uVar1;
  StkId pTVar2;
  CallInfo *pCVar3;
  long lVar4;
  undefined8 uVar5;
  Proto *p;
  Instruction *pIVar6;
  undefined4 uVar7;
  byte bVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  Table *t;
  StkId pTVar12;
  byte *pbVar13;
  int iVar14;
  char *pcVar15;
  lua_CFunction p_Var16;
  long lVar17;
  Table *x_;
  CallInfo *pCVar18;
  int local_64;
  Value local_40;
  undefined4 local_38;
  
  if (L->status == '\x01') {
    pCVar18 = L->ci;
    pTVar12 = L->stack;
    pTVar2 = pCVar18->func;
    pCVar18->func = (StkId)((long)&pTVar12->value_ + pCVar18->extra);
    pCVar18->extra = (long)pTVar2 - (long)pTVar12;
  }
  if (*what == '>') {
    pTVar12 = L->top + -1;
    what = what + 1;
    L->top = pTVar12;
    pCVar18 = (CallInfo *)0x0;
  }
  else {
    pCVar18 = ar->i_ci;
    pTVar12 = pCVar18->func;
  }
  if ((pTVar12->tt_ & 0x1fU) == 6) {
    p_Var16 = (pTVar12->value_).f;
  }
  else {
    p_Var16 = (lua_CFunction)0x0;
  }
  local_64 = 1;
  pbVar13 = (byte *)what;
  do {
    bVar8 = *pbVar13;
    if (bVar8 < 0x66) {
      if (bVar8 != 0x4c) {
        if (bVar8 != 0x53) {
          if (bVar8 == 0) {
            pcVar15 = strchr(what,0x66);
            if (pcVar15 != (char *)0x0) {
              pTVar2 = L->top;
              iVar14 = pTVar12->tt_;
              uVar7 = *(undefined4 *)&pTVar12->field_0xc;
              pTVar2->value_ = pTVar12->value_;
              pTVar2->tt_ = iVar14;
              *(undefined4 *)&pTVar2->field_0xc = uVar7;
              L->top = L->top + 1;
            }
            if (L->status == '\x01') {
              pCVar18 = L->ci;
              pTVar12 = L->stack;
              pTVar2 = pCVar18->func;
              pCVar18->func = (StkId)((long)&pTVar12->value_ + pCVar18->extra);
              pCVar18->extra = (long)pTVar2 - (long)pTVar12;
            }
            pcVar15 = strchr(what,0x4c);
            if (pcVar15 != (char *)0x0) {
              if ((p_Var16 == (lua_CFunction)0x0) || (p_Var16[8] == (_func_int_lua_State_ptr)0x26))
              {
                pTVar12 = L->top;
                pTVar12->tt_ = 0;
                L->top = pTVar12 + 1;
              }
              else {
                lVar4 = *(long *)(*(long *)(p_Var16 + 0x18) + 0x48);
                t = luaH_new(L);
                pTVar12 = L->top;
                (pTVar12->value_).gc = (GCObject *)t;
                pTVar12->tt_ = 0x45;
                L->top = L->top + 1;
                local_40.b = 1;
                local_38 = 1;
                if (0 < *(int *)(*(long *)(p_Var16 + 0x18) + 0x1c)) {
                  lVar17 = 0;
                  do {
                    luaH_setint(L,t,(long)*(int *)(lVar4 + lVar17 * 4),(TValue *)&local_40);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < *(int *)(*(long *)(p_Var16 + 0x18) + 0x1c));
                }
              }
            }
            return local_64;
          }
          goto switchD_001120fc_caseD_6d;
        }
        if ((p_Var16 == (lua_CFunction)0x0) || (p_Var16[8] == (_func_int_lua_State_ptr)0x26)) {
          pcVar15 = "=[C]";
          ar->source = "=[C]";
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar10 = "C";
        }
        else {
          lVar4 = *(long *)(p_Var16 + 0x18);
          lVar17 = *(long *)(lVar4 + 0x68);
          pcVar15 = (char *)(lVar17 + 0x18);
          if (lVar17 == 0) {
            pcVar15 = "=?";
          }
          ar->source = pcVar15;
          uVar5 = *(undefined8 *)(lVar4 + 0x28);
          ar->linedefined = (int)uVar5;
          ar->lastlinedefined = (int)((ulong)uVar5 >> 0x20);
          pcVar10 = "Lua";
          if ((int)uVar5 == 0) {
            pcVar10 = "main";
          }
        }
        ar->what = pcVar10;
        luaO_chunkid(ar->short_src,pcVar15,0x3c);
      }
      goto LAB_00112341;
    }
    switch(bVar8) {
    case 0x6c:
      iVar14 = -1;
      if ((pCVar18 != (CallInfo *)0x0) && ((pCVar18->callstatus & 2) != 0)) {
        lVar4 = *(long *)((pCVar18->func->value_).f + 0x18);
        lVar17 = *(long *)(lVar4 + 0x48);
        if (lVar17 != 0) {
          iVar14 = *(int *)(lVar17 + (((long)(pCVar18->u).l.savedpc - *(long *)(lVar4 + 0x38)) *
                                      0x40000000 + -0x100000000 >> 0x20) * 4);
        }
      }
      ar->currentline = iVar14;
      break;
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
switchD_001120fc_caseD_6d:
      local_64 = 0;
      break;
    case 0x6e:
      if (pCVar18 == (CallInfo *)0x0) goto switchD_00112317_caseD_9;
      pcVar15 = "__gc";
      pcVar10 = "metamethod";
      if ((pCVar18->callstatus >> 8 & 1) != 0) goto switchD_00112317_caseD_29;
      if ((pCVar18->callstatus & 0x20) != 0) goto switchD_00112317_caseD_9;
      pCVar3 = pCVar18->previous;
      if ((pCVar3->callstatus & 2) == 0) goto switchD_00112317_caseD_9;
      pcVar15 = "?";
      pcVar10 = "hook";
      if ((pCVar3->callstatus & 4) != 0) goto switchD_00112317_caseD_29;
      p = *(Proto **)((pCVar3->func->value_).f + 0x18);
      pIVar6 = p->code;
      iVar14 = (int)((ulong)((long)(pCVar3->u).l.savedpc - (long)pIVar6) >> 2);
      uVar1 = pIVar6[(long)iVar14 + -1];
      uVar9 = uVar1 & 0x3f;
      pcVar10 = "for iterator";
      pcVar15 = "for iterator";
      switch(uVar9) {
      case 6:
      case 7:
      case 0xc:
        uVar11 = 0;
        break;
      case 8:
      case 10:
        uVar11 = 1;
        break;
      default:
        goto switchD_00112317_caseD_9;
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
        uVar11 = (ulong)(uVar9 - 7);
        break;
      case 0x19:
        uVar11 = 0x12;
        break;
      case 0x1a:
        uVar11 = 0x13;
        break;
      case 0x1c:
        uVar11 = 4;
        break;
      case 0x1d:
        uVar11 = 0x16;
        break;
      case 0x1f:
        uVar11 = 5;
        break;
      case 0x20:
        uVar11 = 0x14;
        break;
      case 0x21:
        uVar11 = 0x15;
        break;
      case 0x24:
      case 0x25:
        pcVar15 = getobjname(p,iVar14 + -1,uVar1 >> 6 & 0xff,&ar->name);
        ar->namewhat = pcVar15;
        if (pcVar15 != (char *)0x0) goto LAB_00112341;
        goto switchD_00112317_caseD_9;
      case 0x29:
        goto switchD_00112317_caseD_29;
      }
      pcVar15 = (char *)(L->l_G->tmname[uVar11] + 1);
      pcVar10 = "metamethod";
switchD_00112317_caseD_29:
      ar->name = pcVar15;
      ar->namewhat = pcVar10;
      break;
    case 0x74:
      if (pCVar18 == (CallInfo *)0x0) {
        bVar8 = 0;
      }
      else {
        bVar8 = (byte)pCVar18->callstatus & 0x20;
      }
      ar->istailcall = bVar8;
      break;
    case 0x75:
      if (p_Var16 == (lua_CFunction)0x0) {
        ar->nups = '\0';
      }
      else {
        ar->nups = (uchar)p_Var16[10];
        if (p_Var16[8] != (_func_int_lua_State_ptr)0x26) {
          ar->isvararg = *(char *)(*(long *)(p_Var16 + 0x18) + 0xb);
          ar->nparams = *(uchar *)(*(long *)(p_Var16 + 0x18) + 10);
          break;
        }
      }
      ar->nparams = '\0';
      ar->isvararg = '\x01';
      break;
    default:
      if (bVar8 != 0x66) goto switchD_001120fc_caseD_6d;
    }
LAB_00112341:
    pbVar13 = pbVar13 + 1;
  } while( true );
switchD_00112317_caseD_9:
  ar->namewhat = "";
  ar->name = (char *)0x0;
  goto LAB_00112341;
}

Assistant:

LUA_API int lua_getinfo (lua_State *L, const char *what, lua_Debug *ar) {
  int status;
  Closure *cl;
  CallInfo *ci;
  StkId func;
  lua_lock(L);
  swapextra(L);
  if (*what == '>') {
    ci = NULL;
    func = L->top - 1;
    api_check(L, ttisfunction(func), "function expected");
    what++;  /* skip the '>' */
    L->top--;  /* pop function */
  }
  else {
    ci = ar->i_ci;
    func = ci->func;
    lua_assert(ttisfunction(ci->func));
  }
  cl = ttisclosure(func) ? clvalue(func) : NULL;
  status = auxgetinfo(L, what, ar, cl, ci);
  if (strchr(what, 'f')) {
    setobjs2s(L, L->top, func);
    api_incr_top(L);
  }
  swapextra(L);  /* correct before option 'L', which can raise a mem. error */
  if (strchr(what, 'L'))
    collectvalidlines(L, cl);
  lua_unlock(L);
  return status;
}